

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapfilter.cpp
# Opt level: O3

void __thiscall
QPixmapConvolutionFilter::draw
          (QPixmapConvolutionFilter *this,QPainter *painter,QPointF *p,QPixmap *src,QRectF *srcRect)

{
  long lVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  Representation RVar5;
  undefined4 uVar6;
  uint uVar7;
  long *plVar8;
  QImage *destImage;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  qreal *pqVar13;
  QTransform *pQVar14;
  QRectF *this_00;
  long in_FS_OFFSET;
  byte bVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  int iVar23;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  QRect QVar24;
  QPointF local_e8;
  qreal local_d8;
  qreal qStack_d0;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  QRectF local_a8;
  QTransform mat;
  
  bVar15 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QPixmapFilter).field_0x8;
  cVar3 = QPainter::isActive();
  if ((((cVar3 == '\0') || (*(int *)(lVar2 + 0x88) < 1)) || (*(int *)(lVar2 + 0x8c) < 1)) ||
     (cVar3 = QPixmap::isNull(), cVar3 != '\0')) goto LAB_0039633c;
  QPainter::paintEngine();
  plVar8 = (long *)QPaintEngine::paintDevice();
  iVar4 = (**(code **)(*plVar8 + 0x10))(plVar8);
  if (iVar4 == 3) {
    QPainter::paintEngine();
    destImage = (QImage *)QPaintEngine::paintDevice();
    pqVar13 = (qreal *)&DAT_006ce428;
    pQVar14 = &mat;
    for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
      pQVar14->m_matrix[0][0] = *pqVar13;
      pqVar13 = pqVar13 + (ulong)bVar15 * -2 + 1;
      pQVar14 = (QTransform *)((long)pQVar14 + ((ulong)bVar15 * -2 + 1) * 8);
    }
    QPainter::combinedTransform();
    iVar4 = QTransform::type();
    if (1 < iVar4) goto LAB_003960aa;
    QPainter::paintEngine();
    iVar4 = QRasterPaintEngine::clipType();
    if (iVar4 == 1) goto LAB_003960aa;
    local_a8.w = -NAN;
    local_a8.h = -NAN;
    local_a8.xp = -NAN;
    local_a8.yp = -NAN;
    QRasterPaintEngine::clipBoundingRect();
    local_b8 = 0xffffffff;
    uStack_b4 = 0xffffffff;
    uStack_b0 = 0xffffffff;
    uStack_ac = 0xffffffff;
    local_c8 = 0xffffffff;
    uStack_c4 = 0xffffffff;
    uStack_c0 = 0xffffffff;
    uStack_bc = 0xffffffff;
    if ((srcRect->w <= 0.0) || (srcRect->h <= 0.0)) {
      auVar22 = QPixmap::rect();
      local_e8.xp = (qreal)auVar22._0_4_;
      local_e8.yp = (qreal)auVar22._4_4_;
      local_d8 = (qreal)(((long)auVar22._8_4_ - (long)auVar22._0_4_) + 1);
      qStack_d0 = (qreal)(((auVar22._8_8_ >> 0x20) - (auVar22._0_8_ >> 0x20)) + 1);
    }
    else {
      local_e8.xp = srcRect->xp;
      local_e8.yp = srcRect->yp;
      local_d8 = srcRect->w;
      qStack_d0 = srcRect->h;
    }
    (**(code **)(*(long *)&this->super_QPixmapFilter + 0x60))(&local_c8,this,&local_e8);
    lVar10 = QPainter::deviceTransform();
    local_e8.xp = p->xp + *(double *)(lVar10 + 0x30) + (double)CONCAT44(uStack_c4,local_c8);
    local_e8.yp = p->yp + *(double *)(lVar10 + 0x38) + (double)CONCAT44(uStack_bc,uStack_c0);
    local_d8 = (qreal)CONCAT44(uStack_b4,local_b8);
    qStack_d0 = (qreal)CONCAT44(uStack_ac,uStack_b0);
    cVar3 = QRectF::contains(&local_a8);
    if ((cVar3 == '\0') || (destImage == (QImage *)0x0)) goto LAB_003960aa;
    lVar10 = QPainter::deviceTransform();
    local_a8.xp = p->xp + *(double *)(lVar10 + 0x30);
    local_a8.yp = p->yp + *(double *)(lVar10 + 0x38);
    this_00 = (QRectF *)&mat;
    QPixmap::toImage();
    convolute(destImage,(QPointF *)&local_a8,(QImage *)this_00,srcRect,CompositionMode_SourceOver,
              *(qreal **)(lVar2 + 0x80),*(int *)(lVar2 + 0x88),*(int *)(lVar2 + 0x8c));
  }
  else {
LAB_003960aa:
    if ((srcRect->w != 0.0) || (((NAN(srcRect->w) || (srcRect->h != 0.0)) || (NAN(srcRect->h))))) {
      QVar24 = QRectF::toRect(srcRect);
    }
    else {
      QVar24 = (QRect)QPixmap::rect();
    }
    RVar5 = QVar24.x1.m_i;
    dVar16 = (double)(((long)QVar24.x2.m_i.m_i - (long)RVar5.m_i) + 1);
    dVar17 = (double)(((QVar24._8_8_ >> 0x20) - (QVar24._0_8_ >> 0x20)) + 1);
    dVar18 = (double)QVar24.y1.m_i.m_i;
    local_a8.xp = (double)RVar5.m_i;
    local_a8.yp = dVar18;
    local_a8.w = dVar16;
    local_a8.h = dVar17;
    uVar6 = (**(code **)(*(long *)&this->super_QPixmapFilter + 0x60))(&mat,this,&local_a8);
    auVar21._0_8_ =
         (double)((ulong)mat.m_matrix[0][0] & 0x8000000000000000 | 0x3fe0000000000000) +
         mat.m_matrix[0][0];
    auVar21._8_8_ =
         (double)((ulong)mat.m_matrix[0][1] & 0x8000000000000000 | 0x3fe0000000000000) +
         mat.m_matrix[0][1];
    auVar22 = maxpd(auVar21,_DAT_006605e0);
    iVar4 = (int)(double)(~-(ulong)(2147483647.0 < auVar21._0_8_) & auVar22._0_8_ |
                         -(ulong)(2147483647.0 < auVar21._0_8_) & 0x41dfffffffc00000);
    iVar23 = (int)(double)(~-(ulong)(2147483647.0 < auVar21._8_8_) & auVar22._8_8_ |
                          -(ulong)(2147483647.0 < auVar21._8_8_) & 0x41dfffffffc00000);
    dVar19 = (mat.m_matrix[0][0] - (double)iVar4) * 0.5 + mat.m_matrix[0][2];
    dVar20 = (mat.m_matrix[0][1] - (double)iVar23) * 0.5 + mat.m_matrix[1][0];
    dVar19 = (double)((ulong)dVar19 & 0x8000000000000000 | 0x3fe0000000000000) + dVar19;
    dVar20 = (double)((ulong)dVar20 & 0x8000000000000000 | 0x3fe0000000000000) + dVar20;
    auVar22._4_4_ = -(uint)(DAT_006605e0._8_8_ < dVar19);
    auVar22._0_4_ = -(uint)((double)DAT_006605e0 < dVar20);
    auVar22._8_4_ = -(uint)(2147483647.0 < dVar20);
    auVar22._12_4_ = -(uint)(2147483647.0 < dVar19);
    uVar7 = movmskps(uVar6,auVar22);
    uVar12 = 0x80000000;
    if ((uVar7 & 2) != 0) {
      uVar12 = (ulong)(uint)(int)dVar19;
    }
    local_a8.w = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    uVar9 = 0x8000000000000000;
    if ((uVar7 & 1) != 0) {
      uVar9 = (ulong)(uint)(int)dVar20 << 0x20;
    }
    uVar11 = 0x7fffffff00000000;
    if ((uVar7 & 4) == 0) {
      uVar11 = uVar9;
    }
    uVar9 = 0x7fffffff;
    if ((uVar7 & 8) == 0) {
      uVar9 = uVar12;
    }
    mat.m_matrix[0][0] = (qreal)(uVar9 | uVar11);
    this_00 = &local_a8;
    QImage::QImage((QImage *)this_00,(QSize *)&mat,Format_ARGB32_Premultiplied);
    dVar19 = (double)(RVar5.m_i - iVar4);
    dVar20 = (double)(QVar24.y1.m_i.m_i - iVar23);
    local_e8.xp = dVar19;
    local_e8.yp = dVar20;
    QPixmap::toImage();
    mat.m_matrix[0][0] = (double)RVar5.m_i;
    mat.m_matrix[0][1] = dVar18;
    mat.m_matrix[0][2] = dVar16;
    mat.m_matrix[1][0] = dVar17;
    convolute((QImage *)this_00,&local_e8,(QImage *)&local_c8,(QRectF *)&mat,CompositionMode_Source,
              *(qreal **)(lVar2 + 0x80),*(int *)(lVar2 + 0x88),*(int *)(lVar2 + 0x8c));
    QImage::~QImage((QImage *)&local_c8);
    mat.m_matrix[0][0] = p->xp - dVar19;
    mat.m_matrix[0][1] = p->yp - dVar20;
    QPainter::drawImage((QPointF *)painter,(QImage *)&mat);
  }
  QImage::~QImage((QImage *)this_00);
LAB_0039633c:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPixmapConvolutionFilter::draw(QPainter *painter, const QPointF &p, const QPixmap &src, const QRectF& srcRect) const
{
    Q_D(const QPixmapConvolutionFilter);
    if (!painter->isActive())
        return;

    if (d->kernelWidth<=0 || d->kernelHeight <= 0)
        return;

    if (src.isNull())
        return;

    // raster implementation

    QImage *target = nullptr;
    if (painter->paintEngine()->paintDevice()->devType() == QInternal::Image) {
        target = static_cast<QImage *>(painter->paintEngine()->paintDevice());

        QTransform mat = painter->combinedTransform();

        if (mat.type() > QTransform::TxTranslate) {
            // Disabled because of transformation...
            target = nullptr;
        } else {
            QRasterPaintEngine *pe = static_cast<QRasterPaintEngine *>(painter->paintEngine());
            if (pe->clipType() == QRasterPaintEngine::ComplexClip)
                // disabled because of complex clipping...
                target = nullptr;
            else {
                QRectF clip = pe->clipBoundingRect();
                QRectF rect = boundingRectFor(srcRect.isEmpty() ? src.rect() : srcRect);
                QTransform x = painter->deviceTransform();
                if (!clip.contains(rect.translated(x.dx() + p.x(), x.dy() + p.y()))) {
                    target = nullptr;
                }

            }
        }
    }

    if (target) {
        QTransform x = painter->deviceTransform();
        QPointF offset(x.dx(), x.dy());

        convolute(target, p+offset, src.toImage(), srcRect, QPainter::CompositionMode_SourceOver, d->convolutionKernel, d->kernelWidth, d->kernelHeight);
    } else {
        QRect srect = srcRect.isNull() ? src.rect() : srcRect.toRect();
        QRect rect = boundingRectFor(srect).toRect();
        QImage result = QImage(rect.size(), QImage::Format_ARGB32_Premultiplied);
        QPoint offset = srect.topLeft() - rect.topLeft();
        convolute(&result,
                  offset,
                  src.toImage(),
                  srect,
                  QPainter::CompositionMode_Source,
                  d->convolutionKernel,
                  d->kernelWidth,
                  d->kernelHeight);
        painter->drawImage(p - offset, result);
    }
}